

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

_Bool ts_node_child_iterator_next(NodeChildIterator *self,TSNode *result)

{
  SubtreeHeapData *pSVar1;
  Subtree *pSVar2;
  TSTree *pTVar3;
  _Bool _Var4;
  uint uVar5;
  ulong uVar6;
  Length LVar7;
  
  pSVar1 = (self->parent).ptr;
  if (pSVar1 == (SubtreeHeapData *)0x0) {
    _Var4 = false;
  }
  else {
    uVar6 = (ulong)self->child_index;
    _Var4 = false;
    uVar5 = 0;
    if (self->child_index != pSVar1->child_count) {
      pSVar2 = (pSVar1->field_17).field_0.children;
      _Var4 = ts_subtree_extra(pSVar2[uVar6]);
      if (!_Var4) {
        if (self->alias_sequence == (TSSymbol *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (uint)self->alias_sequence[self->structural_child_index];
        }
        self->structural_child_index = self->structural_child_index + 1;
      }
      pSVar2 = pSVar2 + uVar6;
      if (uVar6 == 0) {
        LVar7 = self->position;
      }
      else {
        LVar7 = ts_subtree_padding(*pSVar2);
        LVar7 = length_add(self->position,LVar7);
        self->position = LVar7;
      }
      pTVar3 = self->tree;
      result->context[0] = LVar7.bytes;
      result->context[1] = LVar7.extent.row;
      result->context[2] = LVar7.extent.column;
      result->context[3] = uVar5;
      result->id = pSVar2;
      result->tree = pTVar3;
      LVar7 = ts_subtree_size(*pSVar2);
      LVar7 = length_add(self->position,LVar7);
      self->position = LVar7;
      self->child_index = self->child_index + 1;
      _Var4 = true;
    }
  }
  return _Var4;
}

Assistant:

static inline bool ts_node_child_iterator_next(NodeChildIterator *self, TSNode *result) {
  if (!self->parent.ptr || self->child_index == self->parent.ptr->child_count) return false;
  const Subtree *child = &self->parent.ptr->children[self->child_index];
  TSSymbol alias_symbol = 0;
  if (!ts_subtree_extra(*child)) {
    if (self->alias_sequence) {
      alias_symbol = self->alias_sequence[self->structural_child_index];
    }
    self->structural_child_index++;
  }
  if (self->child_index > 0) {
    self->position = length_add(self->position, ts_subtree_padding(*child));
  }
  *result = ts_node_new(
    self->tree,
    child,
    self->position,
    alias_symbol
  );
  self->position = length_add(self->position, ts_subtree_size(*child));
  self->child_index++;
  return true;
}